

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IO.cpp
# Opt level: O3

void __thiscall IO::singleStates(IO *this,ModelInstance *model,string *filename)

{
  int *piVar1;
  ostream *poVar2;
  int *piVar3;
  ofstream outstream;
  long local_228;
  filebuf local_220 [240];
  ios_base local_130 [264];
  
  std::ofstream::ofstream(&local_228);
  std::ofstream::open((string *)&local_228,(_Ios_Openmode)filename);
  piVar1 = (model->states).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (piVar3 = (model->states).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start; piVar3 != piVar1; piVar3 = piVar3 + 1) {
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&local_228,*piVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\t",1);
  }
  std::ios::widen((char)&local_228 + (char)*(undefined8 *)(local_228 + -0x18));
  std::ostream::put((char)&local_228);
  std::ostream::flush();
  std::ofstream::close();
  local_228 = _VTT;
  *(undefined8 *)(local_220 + *(long *)(_VTT + -0x18) + -8) = _memcpy;
  std::filebuf::~filebuf(local_220);
  std::ios_base::~ios_base(local_130);
  return;
}

Assistant:

void IO::singleStates(ModelInstance *model, std::string filename) {
	std::ofstream outstream;
	outstream.open(filename, std::ios::app);
	for (int thisstate : model->states){
		outstream << thisstate << "\t";
	}
	outstream << std::endl;
	outstream.close();
}